

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int file_gen_utility_names(archive_write *a,file_conflict *file)

{
  char cVar1;
  void *pvVar2;
  wchar_t wVar3;
  mode_t mVar4;
  int *piVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  size_t len;
  char *pp;
  size_t len2;
  size_t local_68;
  char *local_60;
  void *local_58;
  archive_string *local_50;
  archive_string *local_48;
  archive_string *local_40;
  size_t local_38;
  
  pvVar2 = a->format_data;
  (file->parentdir).length = 0;
  (file->basename).length = 0;
  (file->symlink).length = 0;
  if (file->parent == file) {
    return 0;
  }
  wVar3 = _archive_entry_pathname_l
                    (file->entry,&local_60,&local_68,*(archive_string_conv **)((long)pvVar2 + 0x118)
                    );
  if (wVar3 == L'\0') {
    iVar11 = 0;
    local_58 = pvVar2;
  }
  else {
    piVar5 = __errno_location();
    if (*piVar5 == 0xc) {
      pcVar9 = "Can\'t allocate memory for Pathname";
LAB_0017b2c0:
      archive_set_error(&a->archive,0xc,pcVar9);
      return -0x1e;
    }
    local_58 = pvVar2;
    pcVar9 = archive_entry_pathname(file->entry);
    archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to UTF-8",pcVar9);
    iVar11 = -0x14;
  }
  local_48 = &file->parentdir;
  local_50 = &file->basename;
  local_40 = &file->symlink;
  (file->parentdir).length = 0;
  archive_strncat(local_48,local_60,local_68);
  local_68 = (file->parentdir).length;
  pcVar9 = (file->parentdir).s;
  pcVar7 = pcVar9;
LAB_0017b0e0:
  do {
    if (*pcVar7 == '.') {
      cVar1 = pcVar7[1];
      if (cVar1 != '\0') {
        if (cVar1 != '/') {
          if (cVar1 != '.') break;
          if (pcVar7[2] != '\0') {
            if (pcVar7[2] != '/') break;
            pcVar7 = pcVar7 + 3;
            local_68 = local_68 - 3;
            goto LAB_0017b0e0;
          }
        }
        pcVar7 = pcVar7 + 2;
        local_68 = local_68 - 2;
        goto LAB_0017b0e0;
      }
    }
    else if (*pcVar7 != '/') break;
    pcVar7 = pcVar7 + 1;
    local_68 = local_68 - 1;
  } while( true );
  sVar10 = local_68;
  if (pcVar7 != pcVar9) {
    memmove(pcVar9,pcVar7,local_68 + 1);
    sVar10 = local_68;
  }
  do {
    pcVar7 = pcVar9;
    if (sVar10 == 0) break;
    uVar6 = sVar10;
    if (pcVar9[sVar10 - 1] == '/') {
      pcVar9[sVar10 - 1] = '\0';
      uVar6 = local_68 - 1;
      local_68 = uVar6;
    }
    if (1 < uVar6) {
      if ((pcVar9[uVar6 - 2] == '/') && (pcVar9[uVar6 - 1] == '.')) {
        pcVar9[uVar6 - 2] = '\0';
        uVar6 = local_68 - 2;
        local_68 = uVar6;
      }
      if ((((2 < uVar6) && (pcVar9[uVar6 - 3] == '/')) && (pcVar9[uVar6 - 2] == '.')) &&
         (pcVar9[uVar6 - 1] == '.')) {
        pcVar9[uVar6 - 3] = '\0';
        uVar6 = local_68 - 3;
        local_68 = uVar6;
      }
    }
    bVar14 = sVar10 != uVar6;
    sVar10 = uVar6;
  } while (bVar14);
LAB_0017b1c5:
  pcVar12 = pcVar7;
  if (*pcVar12 == '/') {
    pcVar7 = pcVar12 + 1;
    if (pcVar12[1] == '.') {
      if (pcVar12[2] == '.') {
        if (pcVar12[3] == '/') {
          pcVar7 = pcVar12;
          do {
            pcVar7 = pcVar7 + -1;
            if (pcVar7 < pcVar9) break;
          } while (*pcVar7 != '/');
          if (pcVar9 < pcVar7) {
            strcpy(pcVar7,pcVar12 + 3);
          }
          else {
            strcpy(pcVar9,pcVar12 + 4);
            pcVar7 = pcVar9;
          }
        }
      }
      else if (pcVar12[2] == '/') {
        pcVar7 = pcVar12 + 2;
        goto LAB_0017b209;
      }
    }
    else if (pcVar12[1] == '/') {
LAB_0017b209:
      sVar8 = strlen(pcVar7);
      memmove(pcVar12,pcVar7,sVar8 + 1);
      pcVar7 = pcVar12;
    }
    goto LAB_0017b1c5;
  }
  if (*pcVar12 != '\0') {
    pcVar7 = pcVar12 + 1;
    goto LAB_0017b1c5;
  }
  local_68 = strlen(pcVar9);
  mVar4 = archive_entry_filetype(file->entry);
  if (mVar4 == 0xa000) {
    wVar3 = _archive_entry_symlink_l
                      (file->entry,&local_60,&local_38,
                       *(archive_string_conv **)((long)local_58 + 0x118));
    if (wVar3 != L'\0') {
      piVar5 = __errno_location();
      if (*piVar5 == 0xc) {
        pcVar9 = "Can\'t allocate memory for Linkname";
        goto LAB_0017b2c0;
      }
      pcVar7 = archive_entry_symlink(file->entry);
      archive_set_error(&a->archive,0x54,"Can\'t translate symlink \'%s\' to UTF-8",pcVar7);
      iVar11 = -0x14;
    }
    (file->symlink).length = 0;
    archive_strncat(local_40,local_60,local_38);
  }
  pcVar12 = (char *)0x0;
  for (pcVar7 = pcVar9; (pcVar13 = pcVar7, *pcVar7 == '/' || (pcVar13 = pcVar12, *pcVar7 != '\0'));
      pcVar7 = pcVar7 + 1) {
    pcVar12 = pcVar13;
  }
  if (pcVar12 == (char *)0x0) {
    (file->parentdir).length = local_68;
    (file->basename).length = 0;
    archive_string_concat(local_50,local_48);
    (file->parentdir).length = 0;
    *(file->parentdir).s = '\0';
  }
  else {
    *pcVar12 = '\0';
    (file->parentdir).length = (long)pcVar12 - (long)pcVar9;
    (file->basename).length = 0;
    sVar8 = strlen(pcVar12 + 1);
    archive_strncat(local_50,pcVar12 + 1,sVar8);
  }
  return iVar11;
}

Assistant:

static int
file_gen_utility_names(struct archive_write *a, struct file *file)
{
	struct xar *xar;
	const char *pp;
	char *p, *dirname, *slash;
	size_t len;
	int r = ARCHIVE_OK;

	xar = (struct xar *)a->format_data;
	archive_string_empty(&(file->parentdir));
	archive_string_empty(&(file->basename));
	archive_string_empty(&(file->symlink));

	if (file->parent == file)/* virtual root */
		return (ARCHIVE_OK);

	if (archive_entry_pathname_l(file->entry, &pp, &len, xar->sconv)
	    != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to UTF-8",
		    archive_entry_pathname(file->entry));
		r = ARCHIVE_WARN;
	}
	archive_strncpy(&(file->parentdir), pp, len);
	len = file->parentdir.length;
	p = dirname = file->parentdir.s;
	/*
	 * Convert a path-separator from '\' to  '/'
	 */
	cleanup_backslash(p, len);

	/*
	 * Remove leading '/', '../' and './' elements
	 */
	while (*p) {
		if (p[0] == '/') {
			p++;
			len--;
		} else if (p[0] != '.')
			break;
		else if (p[1] == '.' && p[2] == '/') {
			p += 3;
			len -= 3;
		} else if (p[1] == '/' || (p[1] == '.' && p[2] == '\0')) {
			p += 2;
			len -= 2;
		} else if (p[1] == '\0') {
			p++;
			len--;
		} else
			break;
	}
	if (p != dirname) {
		memmove(dirname, p, len+1);
		p = dirname;
	}
	/*
	 * Remove "/","/." and "/.." elements from tail.
	 */
	while (len > 0) {
		size_t ll = len;

		if (p[len-1] == '/') {
			p[len-1] = '\0';
			len--;
		}
		if (len > 1 && p[len-2] == '/' && p[len-1] == '.') {
			p[len-2] = '\0';
			len -= 2;
		}
		if (len > 2 && p[len-3] == '/' && p[len-2] == '.' &&
		    p[len-1] == '.') {
			p[len-3] = '\0';
			len -= 3;
		}
		if (ll == len)
			break;
	}
	while (*p) {
		if (p[0] == '/') {
			if (p[1] == '/')
				/* Convert '//' --> '/' */
				memmove(p, p+1, strlen(p+1) + 1);
			else if (p[1] == '.' && p[2] == '/')
				/* Convert '/./' --> '/' */
				memmove(p, p+2, strlen(p+2) + 1);
			else if (p[1] == '.' && p[2] == '.' && p[3] == '/') {
				/* Convert 'dir/dir1/../dir2/'
				 *     --> 'dir/dir2/'
				 */
				char *rp = p -1;
				while (rp >= dirname) {
					if (*rp == '/')
						break;
					--rp;
				}
				if (rp > dirname) {
					strcpy(rp, p+3);
					p = rp;
				} else {
					strcpy(dirname, p+4);
					p = dirname;
				}
			} else
				p++;
		} else
			p++;
	}
	p = dirname;
	len = strlen(p);

	if (archive_entry_filetype(file->entry) == AE_IFLNK) {
		size_t len2;
		/* Convert symlink name too. */
		if (archive_entry_symlink_l(file->entry, &pp, &len2,
		    xar->sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate symlink '%s' to UTF-8",
			    archive_entry_symlink(file->entry));
			r = ARCHIVE_WARN;
		}
		archive_strncpy(&(file->symlink), pp, len2);
		cleanup_backslash(file->symlink.s, file->symlink.length);
	}
	/*
	 * - Count up directory elements.
	 * - Find out the position which points the last position of
	 *   path separator('/').
	 */
	slash = NULL;
	for (; *p != '\0'; p++)
		if (*p == '/')
			slash = p;
	if (slash == NULL) {
		/* The pathname doesn't have a parent directory. */
		file->parentdir.length = len;
		archive_string_copy(&(file->basename), &(file->parentdir));
		archive_string_empty(&(file->parentdir));
		*file->parentdir.s = '\0';
		return (r);
	}

	/* Make a basename from dirname and slash */
	*slash  = '\0';
	file->parentdir.length = slash - dirname;
	archive_strcpy(&(file->basename),  slash + 1);
	return (r);
}